

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qaccessiblewidgets.cpp
# Opt level: O3

int __thiscall
QAccessibleMdiArea::indexOfChild(QAccessibleMdiArea *this,QAccessibleInterface *child)

{
  long *plVar1;
  qsizetype qVar2;
  long lVar3;
  QMdiArea *pQVar4;
  long lVar5;
  int iVar6;
  long in_FS_OFFSET;
  QList<QMdiSubWindow_*> local_40;
  long local_28;
  
  local_28 = *(long *)(in_FS_OFFSET + 0x28);
  iVar6 = -1;
  if ((child != (QAccessibleInterface *)0x0) &&
     (lVar3 = (**(code **)(*(long *)child + 0x18))(child), lVar3 != 0)) {
    pQVar4 = (QMdiArea *)(**(code **)(*(long *)&this->super_QAccessibleWidget + 0x18))(this);
    QMdiArea::subWindowList(&local_40,pQVar4,CreationOrder);
    qVar2 = local_40.d.size;
    if (&(local_40.d.d)->super_QArrayData != (QArrayData *)0x0) {
      LOCK();
      ((local_40.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
           ((local_40.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + -1;
      UNLOCK();
      if (((local_40.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i == 0) {
        QArrayData::deallocate(&(local_40.d.d)->super_QArrayData,8,0x10);
      }
    }
    if (qVar2 != 0) {
      (**(code **)(*(long *)child + 0x18))(child);
      lVar3 = QMetaObject::cast((QObject *)&QMdiSubWindow::staticMetaObject);
      if (lVar3 != 0) {
        pQVar4 = (QMdiArea *)(**(code **)(*(long *)&this->super_QAccessibleWidget + 0x18))(this);
        QMdiArea::subWindowList(&local_40,pQVar4,CreationOrder);
        if (local_40.d.size == 0) {
LAB_0051d52a:
          iVar6 = -1;
        }
        else {
          iVar6 = -1;
          lVar5 = 0;
          do {
            if (local_40.d.size << 3 == lVar5) goto LAB_0051d52a;
            iVar6 = iVar6 + 1;
            plVar1 = (long *)((long)local_40.d.ptr + lVar5);
            lVar5 = lVar5 + 8;
          } while (*plVar1 != lVar3);
        }
        if (&(local_40.d.d)->super_QArrayData != (QArrayData *)0x0) {
          LOCK();
          ((local_40.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
               ((local_40.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + -1;
          UNLOCK();
          if (((local_40.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i == 0) {
            QArrayData::deallocate(&(local_40.d.d)->super_QArrayData,8,0x10);
          }
        }
      }
    }
  }
  if (*(long *)(in_FS_OFFSET + 0x28) != local_28) {
    __stack_chk_fail();
  }
  return iVar6;
}

Assistant:

int QAccessibleMdiArea::indexOfChild(const QAccessibleInterface *child) const
{
    if (!child || !child->object() || mdiArea()->subWindowList().isEmpty())
        return -1;
    if (QMdiSubWindow *window = qobject_cast<QMdiSubWindow *>(child->object())) {
        return mdiArea()->subWindowList().indexOf(window);
    }
    return -1;
}